

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtc.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  clock_t cVar3;
  size_t sVar4;
  undefined7 uVar10;
  longlong lVar5;
  clock_t cVar6;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  code *pcVar11;
  code *pcVar12;
  char *pcVar13;
  int local_3f4;
  allocator<char> local_3ed;
  int local_3ec;
  code *local_3e8;
  code *local_3e0;
  FILE *local_3d8;
  char *local_3d0;
  ulong local_3c8;
  int local_3bc;
  long *local_3b8 [2];
  long local_3a8 [2];
  longlong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  string arg;
  long local_358;
  check_manager checks;
  device_tree tree;
  
  local_3ec = fileno(_stdout);
  cVar3 = clock();
  tree.node_names._M_h._M_buckets = &tree.node_names._M_h._M_single_bucket;
  tree.phandle_node_name = EPAPR;
  tree.valid = true;
  tree.garbage_collect = false;
  tree.reservations.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tree.reservations.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tree.reservations.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tree.root.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  tree.root.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tree.node_names._M_h._M_bucket_count = 1;
  tree.node_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.node_names._M_h._M_element_count = 0;
  tree.node_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tree.node_names._M_h._M_rehash_policy._M_next_resize = 0;
  tree.node_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tree.node_name_parents._M_h._M_buckets = &tree.node_name_parents._M_h._M_single_bucket;
  tree.node_name_parents._M_h._M_bucket_count = 1;
  tree.node_name_parents._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.node_name_parents._M_h._M_element_count = 0;
  tree.node_name_parents._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tree.node_name_parents._M_h._M_rehash_policy._M_next_resize = 0;
  tree.node_name_parents._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tree.node_paths._M_h._M_buckets = &tree.node_paths._M_h._M_single_bucket;
  tree.node_paths._M_h._M_bucket_count = 1;
  tree.node_paths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.node_paths._M_h._M_element_count = 0;
  tree.node_paths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&tree.node_paths._M_h._M_rehash_policy._M_next_resize,0,0x88);
  tree.phandle_targets._M_h._M_bucket_count = 1;
  tree.phandle_targets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.phandle_targets._M_h._M_element_count = 0;
  tree.phandle_targets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tree.used_phandles._M_h._M_buckets = &tree.used_phandles._M_h._M_single_bucket;
  tree.phandle_targets._M_h._M_rehash_policy._M_next_resize = 0;
  tree.phandle_targets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tree.buffers.
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tree.buffers.
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tree.buffers.
  super__Vector_base<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tree.used_phandles._M_h._M_bucket_count = 1;
  tree.used_phandles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.used_phandles._M_h._M_element_count = 0;
  tree.used_phandles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tree.defines._M_h._M_buckets = &tree.defines._M_h._M_single_bucket;
  tree.used_phandles._M_h._M_rehash_policy._M_next_resize = 0;
  tree.used_phandles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tree.include_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tree.include_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tree.include_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tree.defines._M_h._M_bucket_count = 1;
  tree.defines._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tree.defines._M_h._M_element_count = 0;
  tree.defines._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tree.boot_cpu = 0;
  tree.spare_reserve_map_entries = 0;
  tree.minimum_blob_size = 0;
  tree.blob_padding = 0;
  tree.defines._M_h._M_rehash_policy._M_next_resize = 0;
  tree.defines._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tree.is_plugin = false;
  tree.write_symbols = false;
  tree.phandle_targets._M_h._M_buckets = &tree.phandle_targets._M_h._M_single_bucket;
  dtc::fdt::checking::check_manager::check_manager(&checks);
  local_3e8 = (code *)0x0;
  local_3e0 = (code *)0x0;
  local_398 = 0;
  local_388 = 0;
  local_3c8 = 0;
  local_380 = 0;
  local_390 = 0;
  local_3d8 = (FILE *)0x0;
  local_3d0 = "-";
  local_3f4 = 0;
  local_3bc = argc;
switchD_0011f6bd_caseD_71:
  iVar2 = getopt(argc,argv,"@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:");
  __stream = local_3d8;
  if (0x17 < iVar2 - 0x40U) {
    uVar10 = (undefined7)
             ((ulong)((long)&switchD_0011f6bd::switchdataD_0013a5c8 +
                     (long)(int)(&switchD_0011f6bd::switchdataD_0013a5c8)[iVar2 - 0x62]) >> 8);
    switch(iVar2) {
    case 0x62:
      local_398 = strtoll(_optarg,(char **)0x0,10);
      local_388 = CONCAT71((int7)((ulong)local_398 >> 8),1);
      goto switchD_0011f6bd_caseD_71;
    case 99:
    case 0x65:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_0011f5e3_caseD_41;
    case 100:
      if (local_3d8 != (FILE *)0x0) {
        fclose(local_3d8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
      iVar2 = std::__cxx11::string::compare((char *)&arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        local_3d8 = _stdout;
        goto switchD_0011f6bd_caseD_71;
      }
      iVar2 = open(_optarg,0x241,0x1b6);
      local_3d8 = fdopen(iVar2,"w");
      if (local_3d8 != (FILE *)0x0) goto switchD_0011f6bd_caseD_71;
      pcVar13 = "Unable to open dependency file";
      break;
    case 0x66:
      local_3c8 = CONCAT71(uVar10,1);
      goto switchD_0011f6bd_caseD_71;
    case 0x68:
      std::__cxx11::string::string<std::allocator<char>>((string *)local_3b8,*argv,&local_3ed);
      dtc::__xpg_basename((dtc *)&arg,(char *)local_3b8);
      main_cold_8();
      local_3f4 = 0;
      goto LAB_0011ff49;
    case 0x69:
      dtc::fdt::device_tree::add_include_path(&tree,_optarg);
      goto switchD_0011f6bd_caseD_71;
    case 0x6f:
      local_3d0 = _optarg;
      if (((*_optarg == '-') && (_optarg[1] == '\0')) ||
         (local_3ec = open(_optarg,0x241,0x1b6), local_3ec != -1)) goto switchD_0011f6bd_caseD_71;
      pcVar13 = "Unable to open output file";
      break;
    case 0x70:
      lVar5 = strtoll(_optarg,(char **)0x0,10);
      tree.blob_padding = (uint32_t)lVar5;
    case 0x71:
      goto switchD_0011f6bd_caseD_71;
    case 0x73:
      local_380 = CONCAT71(uVar10,1);
      goto switchD_0011f6bd_caseD_71;
    case 0x76:
      local_3f4 = 0;
      fprintf(_stdout,"Version: %s %d.%d.%d compatible with gpl dtc %d.%d.%d\n",*argv,0,5,0,1,4,7);
      goto LAB_0011ff49;
    default:
      if (iVar2 != -1) goto switchD_0011f5e3_caseD_41;
      pcVar12 = local_3e0;
      if (local_3e0 == (code *)0x0) {
        pcVar12 = dtc::fdt::device_tree::parse_dts;
      }
      pcVar11 = local_3e8;
      if (local_3e8 == (code *)0x0) {
        pcVar11 = dtc::fdt::device_tree::write_binary;
      }
      if (_optind < argc) {
        pcVar13 = argv[_optind];
      }
      else {
        pcVar13 = "-";
      }
      if (local_3d8 != (FILE *)0x0) {
        fputs(local_3d0,local_3d8);
        fputs(": ",__stream);
        fputs(pcVar13,__stream);
      }
      cVar6 = clock();
      if (((ulong)pcVar12 & 1) != 0) {
        pcVar12 = *(code **)(pcVar12 +
                            CONCAT26(tree._6_2_,
                                     CONCAT15(tree.garbage_collect,
                                              CONCAT14(tree.valid,tree.phandle_node_name))) + -1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,pcVar13,(allocator<char> *)local_3b8);
      (*pcVar12)(&tree,&arg,__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      }
      if ((local_388 & 1) != 0) {
        tree.boot_cpu = (uint32_t)local_398;
      }
      if (((local_380 & 1) != 0) &&
         (tree.root.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        dtc::fdt::node::sort
                  (tree.root.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (__stream != (FILE *)0x0) {
        putc(10,__stream);
        fclose(__stream);
      }
      if ((tree.valid == false) && ((local_3c8 & 1) == 0)) {
        main_cold_9();
        goto switchD_0011f5e3_caseD_41;
      }
      cVar7 = clock();
      bVar1 = dtc::fdt::checking::check_manager::run_checks(&checks,&tree,true);
      if ((bVar1) || (local_3f4 = 1, (local_3c8 & 1) != 0)) {
        cVar8 = clock();
        iVar2 = local_3ec;
        if (((ulong)pcVar11 & 1) != 0) {
          pcVar11 = *(code **)(pcVar11 +
                              CONCAT26(tree._6_2_,
                                       CONCAT15(tree.garbage_collect,
                                                CONCAT14(tree.valid,tree.phandle_node_name))) + -1);
        }
        (*pcVar11)(&tree,local_3ec);
        close(iVar2);
        local_3f4 = 0;
        cVar9 = clock();
        if ((local_390 & 1) != 0) {
          local_3f4 = 0;
          getrusage(RUSAGE_SELF,(rusage *)&arg);
          fprintf(_stderr,"Peak memory usage: %ld bytes\n",local_358);
          fprintf(_stderr,"Setup and option parsing took %f seconds\n",
                  SUB84((double)(cVar6 - cVar3) / 1000000.0,0));
          fprintf(_stderr,"Parsing took %f seconds\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
          fprintf(_stderr,"Checking took %f seconds\n",SUB84((double)(cVar8 - cVar7) / 1000000.0,0))
          ;
          fprintf(_stderr,"Generating output took %f seconds\n",
                  SUB84((double)(cVar9 - cVar8) / 1000000.0,0));
          fprintf(_stderr,"Total time: %f seconds\n",SUB84((double)(cVar9 - cVar3) / 1000000.0,0));
          fclose(_stdin);
        }
      }
      goto LAB_0011ff49;
    }
    perror(pcVar13);
    goto switchD_0011f5e3_caseD_41;
  }
  switch(iVar2) {
  case 0x40:
    tree.write_symbols = true;
    goto switchD_0011f6bd_caseD_71;
  default:
    goto switchD_0011f5e3_caseD_41;
  case 0x44:
    local_390 = CONCAT71((int7)((ulong)((long)&switchD_0011f5e3::switchdataD_0013a568 +
                                       (long)(int)(&switchD_0011f5e3::switchdataD_0013a568)
                                                  [iVar2 - 0x40U]) >> 8),1);
    goto switchD_0011f6bd_caseD_71;
  case 0x45:
  case 0x57:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
    pcVar13 = _optarg;
    if ((((arg._M_string_length < 4) || (*_optarg != 'n')) || (_optarg[1] != 'o')) ||
       (_optarg[2] != '-')) {
      bVar1 = dtc::fdt::checking::check_manager::enable_checker(&checks,&arg);
      if (!bVar1) {
        main_cold_2();
      }
    }
    else {
      __s = _optarg + 3;
      local_3b8[0] = local_3a8;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,__s,pcVar13 + sVar4 + 3);
      std::__cxx11::string::operator=((string *)&arg,(string *)local_3b8);
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0],local_3a8[0] + 1);
      }
      bVar1 = dtc::fdt::checking::check_manager::disable_checker(&checks,&arg);
      if (!bVar1) {
        main_cold_3();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)arg._M_dataplus._M_p != &arg.field_2) {
      operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
    }
    goto switchD_0011f6bd_caseD_71;
  case 0x48:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
    iVar2 = std::__cxx11::string::compare((char *)&arg);
    if (iVar2 == 0) {
      tree.phandle_node_name = BOTH;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&arg);
      if (iVar2 == 0) {
        tree.phandle_node_name = EPAPR;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&arg);
        if (iVar2 != 0) {
          main_cold_4();
          goto LAB_0011fbab;
        }
        tree.phandle_node_name = LINUX;
      }
    }
    bVar1 = true;
    break;
  case 0x49:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
    iVar2 = std::__cxx11::string::compare((char *)&arg);
    if (iVar2 == 0) {
      if (local_3e8 == (code *)0x0) {
        local_3e8 = dtc::fdt::device_tree::write_dts;
      }
      local_3e0 = dtc::fdt::device_tree::parse_dtb;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&arg);
      if (iVar2 != 0) {
        main_cold_7();
LAB_0011fbab:
        local_3f4 = 1;
        bVar1 = false;
        break;
      }
      local_3e0 = dtc::fdt::device_tree::parse_dts;
    }
    bVar1 = true;
    break;
  case 0x4f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
    iVar2 = std::__cxx11::string::compare((char *)&arg);
    bVar1 = true;
    if (iVar2 == 0) {
      local_3e8 = dtc::fdt::device_tree::write_binary;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&arg);
      if (iVar2 == 0) {
        local_3e8 = dtc::fdt::device_tree::write_asm;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&arg);
        if (iVar2 == 0) {
          if (local_3e0 == (code *)0x0) {
            local_3e0 = dtc::fdt::device_tree::parse_dtb;
          }
          local_3e8 = dtc::fdt::device_tree::write_dts;
        }
        else {
          main_cold_6();
          local_3f4 = 1;
          bVar1 = false;
        }
      }
    }
    argc = local_3bc;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)arg._M_dataplus._M_p != &arg.field_2) {
      operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
      argc = local_3bc;
    }
    goto joined_r0x0011fb2d;
  case 0x50:
    bVar1 = dtc::fdt::device_tree::parse_define(&tree,_optarg);
    if (!bVar1) {
      main_cold_1();
    }
    goto switchD_0011f6bd_caseD_71;
  case 0x52:
    lVar5 = strtoll(_optarg,(char **)0x0,10);
    tree.spare_reserve_map_entries = (uint32_t)lVar5;
    goto switchD_0011f6bd_caseD_71;
  case 0x53:
    lVar5 = strtoll(_optarg,(char **)0x0,10);
    tree.minimum_blob_size = (uint32_t)lVar5;
    goto switchD_0011f6bd_caseD_71;
  case 0x56:
    goto switchD_0011f5e3_caseD_56;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
  }
joined_r0x0011fb2d:
  if (!bVar1) goto LAB_0011ff49;
  goto switchD_0011f6bd_caseD_71;
switchD_0011f5e3_caseD_56:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,_optarg,(allocator<char> *)local_3b8);
  iVar2 = std::__cxx11::string::compare((char *)&arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 != 0) {
    main_cold_5();
switchD_0011f5e3_caseD_41:
    local_3f4 = 1;
LAB_0011ff49:
    dtc::fdt::checking::check_manager::~check_manager(&checks);
    dtc::fdt::device_tree::~device_tree(&tree);
    return local_3f4;
  }
  goto switchD_0011f6bd_caseD_71;
}

Assistant:

int
main(int argc, char **argv)
{
	int ch;
	int outfile = fileno(stdout);
	const char *outfile_name = "-";
	const char *in_file = "-";
	FILE *depfile = 0;
	bool debug_mode = false;
	tree_write_fn_ptr write_fn = nullptr;
	tree_read_fn_ptr read_fn = nullptr;
	uint32_t boot_cpu = 0;
	bool boot_cpu_specified = false;
	bool keep_going = false;
	bool sort = false;
	clock_t c0 = clock();
	class device_tree tree;
	fdt::checking::check_manager checks;
	const char *options = "@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:";

	// Don't forget to update the man page if any more options are added.
	while ((ch = getopt(argc, argv, options)) != -1)
	{
		switch (ch)
		{
		case 'h':
			usage(argv[0]);
			return EXIT_SUCCESS;
		case 'v':
			version(argv[0]);
			return EXIT_SUCCESS;
		case '@':
			tree.write_symbols = true;
			break;
		case 'I':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				read_fn = &device_tree::parse_dtb;
				if (write_fn == nullptr)
				{
					write_fn = &device_tree::write_dts;
				}
			}
			else if (arg == "dts")
			{
				read_fn = &device_tree::parse_dts;
			}
			else
			{
				fprintf(stderr, "Unknown input format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'O':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				write_fn = &device_tree::write_binary;
			}
			else if (arg == "asm")
			{
				write_fn = &device_tree::write_asm;
			}
			else if (arg == "dts")
			{
				write_fn = &device_tree::write_dts;
				if (read_fn == nullptr)
				{
					read_fn = &device_tree::parse_dtb;
				}
			}
			else
			{
				fprintf(stderr, "Unknown output format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'o':
		{
			outfile_name = optarg;
			if (strcmp(outfile_name, "-") != 0)
			{
				outfile = open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666);
				if (outfile == -1)
				{
					perror("Unable to open output file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'D':
			debug_mode = true;
			break;
		case 'V':
			if (string(optarg) != "17")
			{
				fprintf(stderr, "Unknown output format version: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		case 'd':
		{
			if (depfile != 0)
			{
				fclose(depfile);
			}
			if (string(optarg) == "-")
			{
				depfile = stdout;
			}
			else
			{
				depfile = fdopen(open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666), "w");
				if (depfile == 0)
				{
					perror("Unable to open dependency file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'H':
		{
			string arg(optarg);
			if (arg == "both")
			{
				tree.set_phandle_format(device_tree::BOTH);
			}
			else if (arg == "epapr")
			{
				tree.set_phandle_format(device_tree::EPAPR);
			}
			else if (arg == "linux")
			{
				tree.set_phandle_format(device_tree::LINUX);
			}
			else
			{
				fprintf(stderr, "Unknown phandle format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'b':
			// Don't bother to check if strtoll fails, just
			// use the 0 it returns.
			boot_cpu = (uint32_t)strtoll(optarg, 0, 10);
			boot_cpu_specified = true;
			break;
		case 'f':
			keep_going = true;
			break;
		case 'W':
		case 'E':
		{
			string arg(optarg);
			if ((arg.size() > 3) && (strncmp(optarg, "no-", 3) == 0))
			{
				arg = string(optarg+3);
				if (!checks.disable_checker(arg))
				{
					fprintf(stderr, "Checker %s either does not exist or is already disabled\n", optarg+3);
				}
				break;
			}
			if (!checks.enable_checker(arg))
			{
				fprintf(stderr, "Checker %s either does not exist or is already enabled\n", optarg);
			}
			break;
		}
		case 's':
		{
			sort = true;
			break;
		}
		case 'i':
		{
			tree.add_include_path(optarg);
			break;
		}
		// Should quiet warnings, but for now is silently ignored.
		case 'q':
			break;
		case 'R':
			tree.set_empty_reserve_map_entries(strtoll(optarg, 0, 10));
			break;
		case 'S':
			tree.set_blob_minimum_size(strtoll(optarg, 0, 10));
			break;
		case 'p':
			tree.set_blob_padding(strtoll(optarg, 0, 10));
			break;
		case 'P':
			if (!tree.parse_define(optarg))
			{
				fprintf(stderr, "Invalid predefine value %s\n",
				        optarg);
			}
			break;
		default:
			/* 
			 * Since opterr is non-zero, getopt will have
			 * already printed an error message.
			 */
			return EXIT_FAILURE;
		}
	}
	if (read_fn == nullptr)
	{
		read_fn = &device_tree::parse_dts;
	}
	if (write_fn == nullptr)
	{
		write_fn = &device_tree::write_binary;
	}
	if (optind < argc)
	{
		in_file = argv[optind];
	}
	if (depfile != 0)
	{
		fputs(outfile_name, depfile);
		fputs(": ", depfile);
		fputs(in_file, depfile);
	}
	clock_t c1 = clock();
	(tree.*read_fn)(in_file, depfile);
	// Override the boot CPU found in the header, if we're loading from dtb
	if (boot_cpu_specified)
	{
		tree.set_boot_cpu(boot_cpu);
	}
	if (sort)
	{
		tree.sort();
	}
	if (depfile != 0)
	{
		putc('\n', depfile);
		fclose(depfile);
	}
	if (!(tree.is_valid() || keep_going))
	{
		fprintf(stderr, "Failed to parse tree.\n");
		return EXIT_FAILURE;
	}
	clock_t c2 = clock();
	if (!(checks.run_checks(&tree, true) || keep_going))
	{
		return EXIT_FAILURE;
	}
	clock_t c3 = clock();
	(tree.*write_fn)(outfile);
	close(outfile);
	clock_t c4 = clock();

	if (debug_mode)
	{
		struct rusage r;

		getrusage(RUSAGE_SELF, &r);
		fprintf(stderr, "Peak memory usage: %ld bytes\n", r.ru_maxrss);
		fprintf(stderr, "Setup and option parsing took %f seconds\n",
				((double)(c1-c0))/CLOCKS_PER_SEC);
		fprintf(stderr, "Parsing took %f seconds\n",
				((double)(c2-c1))/CLOCKS_PER_SEC);
		fprintf(stderr, "Checking took %f seconds\n",
				((double)(c3-c2))/CLOCKS_PER_SEC);
		fprintf(stderr, "Generating output took %f seconds\n",
				((double)(c4-c3))/CLOCKS_PER_SEC);
		fprintf(stderr, "Total time: %f seconds\n",
				((double)(c4-c0))/CLOCKS_PER_SEC);
		// This is not needed, but keeps valgrind quiet.
		fclose(stdin);
	}
	return EXIT_SUCCESS;
}